

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcTextLiteralWithExtent::~IfcTextLiteralWithExtent
          (IfcTextLiteralWithExtent *this)

{
  undefined1 *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined1 *puVar4;
  
  (this->super_IfcTextLiteral).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0x80f2c0;
  *(undefined8 *)&this->field_0xb8 = 0x80f360;
  *(undefined8 *)
   &(this->super_IfcTextLiteral).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0x80f2e8;
  *(undefined8 *)
   &(this->super_IfcTextLiteral).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0x80f310;
  *(undefined8 *)&(this->super_IfcTextLiteral).field_0x80 = 0x80f338;
  pcVar3 = (this->BoxAlignment)._M_dataplus._M_p;
  paVar2 = &(this->BoxAlignment).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar2) {
    operator_delete(pcVar3,paVar2->_M_allocated_capacity + 1);
  }
  (this->super_IfcTextLiteral).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0x80f438;
  *(undefined8 *)&this->field_0xb8 = 0x80f4b0;
  *(undefined8 *)
   &(this->super_IfcTextLiteral).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0x80f460;
  *(undefined8 *)
   &(this->super_IfcTextLiteral).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0x80f488;
  pcVar3 = (this->super_IfcTextLiteral).Path._M_dataplus._M_p;
  paVar2 = &(this->super_IfcTextLiteral).Path.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar2) {
    operator_delete(pcVar3,paVar2->_M_allocated_capacity + 1);
  }
  this_00 = (this->super_IfcTextLiteral).Placement.
            super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  puVar4 = *(undefined1 **)
            &(this->super_IfcTextLiteral).super_IfcGeometricRepresentationItem.field_0x30;
  puVar1 = &(this->super_IfcTextLiteral).field_0x40;
  if (puVar4 != puVar1) {
    operator_delete(puVar4,*(long *)puVar1 + 1);
  }
  operator_delete(this,0xd0);
  return;
}

Assistant:

IfcTextLiteralWithExtent() : Object("IfcTextLiteralWithExtent") {}